

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmConsole::read_script_param(CVmConsole *this,char *buf,size_t buflen,osfildef *fp)

{
  int iVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  ulong in_RDX;
  undefined1 *in_RSI;
  int c;
  ulong local_20;
  undefined1 *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_RDX == 0) {
    local_4 = 0;
  }
  else {
    while ((iVar1 = fgetc((FILE *)CONCAT71(in_register_00000009,in_CL)), iVar1 != 10 &&
           (iVar1 != -1))) {
      if (1 < local_20) {
        *local_18 = (char)iVar1;
        local_20 = local_20 - 1;
        local_18 = local_18 + 1;
      }
    }
    *local_18 = 0;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CVmConsole::read_script_param(char *buf, size_t buflen, osfildef *fp)
{
    /* ignore zero-size buffer requests */
    if (buflen == 0)
        return FALSE;

    /* read characters until we run out of buffer or reach a newline */
    for (;;)
    {
        /* get the next character */
        int c = osfgetc(fp);

        /* if it's a newline or end of file, we're done */
        if (c == '\n' || c == EOF)
        {
            /* null-terminate the buffer */
            *buf = '\0';

            /* indicate success */
            return TRUE;
        }

        /* 
         *   if there's room in the buffer, add the character - always leave
         *   one byte for the null terminator 
         */
        if (buflen > 1)
        {
            *buf++ = (char)c;
            --buflen;
        }
    }
}